

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

wchar_t assertion_file_contains_lines_any_order(char *file,wchar_t line,char *pathname,char **lines)

{
  char *__s2;
  long lVar1;
  int iVar2;
  char *__ptr;
  char *pcVar3;
  void *__ptr_00;
  size_t sVar4;
  char cVar5;
  long lVar6;
  wchar_t wVar7;
  size_t __size;
  long lVar8;
  bool bVar9;
  bool bVar10;
  size_t buff_size;
  void *local_58;
  size_t local_38;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  __ptr = slurpfile(&local_38,"%s");
  if (__ptr == (char *)0x0) {
    failure_start(pathname,line,"Can\'t read file: %s",pathname);
LAB_001068ba:
    wVar7 = L'\0';
    failure_finish(pathname);
  }
  else {
    lVar8 = -1;
    lVar6 = 8;
    do {
      lVar6 = lVar6 + -8;
      lVar1 = lVar8 + 1;
      lVar8 = lVar8 + 1;
    } while (lines[lVar1] != (char *)0x0);
    if (lVar8 == 0) {
      local_58 = (void *)0x0;
    }
    else {
      local_58 = malloc(-lVar6);
      if (local_58 == (void *)0x0) {
        failure_start(pathname,line,"Can\'t allocate memory");
        goto LAB_001068ba;
      }
      pcVar3 = *lines;
      if (pcVar3 != (char *)0x0) {
        lVar6 = 0;
        do {
          pcVar3 = strdup(pcVar3);
          *(char **)((long)local_58 + lVar6) = pcVar3;
          pcVar3 = *(char **)((long)lines + lVar6 + 8);
          lVar6 = lVar6 + 8;
        } while (pcVar3 != (char *)0x0);
      }
    }
    if ((long)local_38 < 1) {
      __size = 0;
    }
    else {
      cVar5 = '\0';
      __size = 0;
      pcVar3 = __ptr;
      do {
        if ((*pcVar3 == '\r') || (*pcVar3 == '\n')) {
          *pcVar3 = '\0';
        }
        if (cVar5 == '\0') {
          __size = (__size + 1) - (ulong)(*pcVar3 == '\0');
        }
        cVar5 = *pcVar3;
        pcVar3 = pcVar3 + 1;
      } while (pcVar3 < __ptr + local_38);
    }
    if (__size == 0) {
      __ptr_00 = (void *)0x0;
    }
    else {
      __ptr_00 = calloc(8,__size);
      if (__ptr_00 == (void *)0x0) {
        failure_start(pathname,line,"Can\'t allocate memory");
        failure_finish(pathname);
        free(local_58);
        return L'\0';
      }
      if (0 < (long)local_38) {
        lVar6 = 0;
        pcVar3 = __ptr;
        do {
          if (*pcVar3 != '\0') {
            *(char **)((long)__ptr_00 + lVar6 * 8) = pcVar3;
            lVar6 = lVar6 + 1;
          }
          sVar4 = strlen(pcVar3);
          pcVar3 = pcVar3 + sVar4 + 1;
        } while (pcVar3 < __ptr + local_38);
      }
    }
    bVar9 = true;
    if (lVar8 != 0) {
      lVar6 = 0;
      do {
        pcVar3 = *(char **)((long)local_58 + lVar6 * 8);
        if ((pcVar3 != (char *)0x0) && (__size != 0)) {
          sVar4 = 0;
          do {
            __s2 = *(char **)((long)__ptr_00 + sVar4 * 8);
            if ((__s2 != (char *)0x0) && (iVar2 = strcmp(pcVar3,__s2), iVar2 == 0)) {
              free(pcVar3);
              *(undefined8 *)((long)local_58 + lVar6 * 8) = 0;
              *(undefined8 *)((long)__ptr_00 + sVar4 * 8) = 0;
              break;
            }
            sVar4 = sVar4 + 1;
          } while (__size != sVar4);
        }
        lVar6 = lVar6 + 1;
      } while (lVar8 != lVar6);
      iVar2 = 0;
      lVar6 = 0;
      do {
        iVar2 = (iVar2 + 1) - (uint)(*(long *)((long)local_58 + lVar6 * 8) == 0);
        lVar6 = lVar6 + 1;
      } while (lVar8 != lVar6);
      bVar9 = iVar2 == 0;
    }
    bVar10 = true;
    if (__size != 0) {
      iVar2 = 0;
      sVar4 = 0;
      do {
        iVar2 = (iVar2 + 1) - (uint)(*(long *)((long)__ptr_00 + sVar4 * 8) == 0);
        sVar4 = sVar4 + 1;
      } while (__size != sVar4);
      bVar10 = iVar2 == 0;
    }
    if ((bool)(bVar9 & bVar10)) {
      free(__ptr);
      free(local_58);
      free(__ptr_00);
      wVar7 = L'\x01';
    }
    else {
      failure_start(file,line,"File doesn\'t match: %s",pathname);
      if (lVar8 != 0) {
        lVar6 = 0;
        do {
          if (*(long *)((long)local_58 + lVar6 * 8) != 0) {
            logprintf("  Expected but not present: %s\n");
            file = *(char **)((long)local_58 + lVar6 * 8);
            free(file);
          }
          lVar6 = lVar6 + 1;
        } while (lVar8 != lVar6);
      }
      if (__size != 0) {
        sVar4 = 0;
        do {
          if (*(long *)((long)__ptr_00 + sVar4 * 8) != 0) {
            file = "  Present but not expected: %s\n";
            logprintf("  Present but not expected: %s\n");
          }
          sVar4 = sVar4 + 1;
        } while (__size != sVar4);
      }
      failure_finish(file);
      free(__ptr);
      free(local_58);
      free(__ptr_00);
      wVar7 = L'\0';
    }
  }
  return wVar7;
}

Assistant:

int
assertion_file_contains_lines_any_order(const char *file, int line,
    const char *pathname, const char *lines[])
{
	char *buff;
	size_t buff_size;
	size_t expected_count, actual_count, i, j;
	char **expected = NULL;
	char *p, **actual = NULL;
	char c;
	int expected_failure = 0, actual_failure = 0;

	assertion_count(file, line);

	buff = slurpfile(&buff_size, "%s", pathname);
	if (buff == NULL) {
		failure_start(pathname, line, "Can't read file: %s", pathname);
		failure_finish(NULL);
		return (0);
	}

	/* Make a copy of the provided lines and count up the expected
	 * file size. */
	for (i = 0; lines[i] != NULL; ++i) {
	}
	expected_count = i;
	if (expected_count) {
		expected = malloc(sizeof(char *) * expected_count);
		if (expected == NULL) {
			failure_start(pathname, line, "Can't allocate memory");
			failure_finish(NULL);
			return (0);
		}
		for (i = 0; lines[i] != NULL; ++i) {
			expected[i] = strdup(lines[i]);
		}
	}

	/* Break the file into lines */
	actual_count = 0;
	for (c = '\0', p = buff; p < buff + buff_size; ++p) {
		if (*p == '\x0d' || *p == '\x0a')
			*p = '\0';
		if (c == '\0' && *p != '\0')
			++actual_count;
		c = *p;
	}
	if (actual_count) {
		actual = calloc(sizeof(char *), actual_count);
		if (actual == NULL) {
			failure_start(pathname, line, "Can't allocate memory");
			failure_finish(NULL);
			free(expected);
			return (0);
		}
		for (j = 0, p = buff; p < buff + buff_size; p += 1 + strlen(p)) {
			if (*p != '\0') {
				actual[j] = p;
				++j;
			}
		}
	}

	/* Erase matching lines from both lists */
	for (i = 0; i < expected_count; ++i) {
		if (expected[i] == NULL)
			continue;
		for (j = 0; j < actual_count; ++j) {
			if (actual[j] == NULL)
				continue;
			if (strcmp(expected[i], actual[j]) == 0) {
				free(expected[i]);
				expected[i] = NULL;
				actual[j] = NULL;
				break;
			}
		}
	}

	/* If there's anything left, it's a failure */
	for (i = 0; i < expected_count; ++i) {
		if (expected[i] != NULL)
			++expected_failure;
	}
	for (j = 0; j < actual_count; ++j) {
		if (actual[j] != NULL)
			++actual_failure;
	}
	if (expected_failure == 0 && actual_failure == 0) {
		free(buff);
		free(expected);
		free(actual);
		return (1);
	}
	failure_start(file, line, "File doesn't match: %s", pathname);
	for (i = 0; i < expected_count; ++i) {
		if (expected[i] != NULL) {
			logprintf("  Expected but not present: %s\n", expected[i]);
			free(expected[i]);
		}
	}
	for (j = 0; j < actual_count; ++j) {
		if (actual[j] != NULL)
			logprintf("  Present but not expected: %s\n", actual[j]);
	}
	failure_finish(NULL);
	free(buff);
	free(expected);
	free(actual);
	return (0);
}